

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O2

XML_Parser
XML_ExternalEntityParserCreate(XML_Parser oldParser,XML_Char *context,XML_Char *encodingName)

{
  HASH_TABLE *table;
  HASH_TABLE *table_00;
  STRING_POOL *pool;
  XML_Bool XVar1;
  XML_Char XVar2;
  undefined4 uVar3;
  DTD *pDVar4;
  ELEMENT_TYPE *pEVar5;
  XML_Parser pXVar6;
  XML_Parser pXVar7;
  unsigned_long uVar8;
  DTD *table_01;
  HASH_TABLE *pHVar9;
  KEY pXVar10;
  XML_StartElementHandler p_Var11;
  XML_EndElementHandler p_Var12;
  XML_CommentHandler p_Var13;
  XML_StartCdataSectionHandler p_Var14;
  XML_EndCdataSectionHandler p_Var15;
  XML_DefaultHandler p_Var16;
  XML_UnparsedEntityDeclHandler p_Var17;
  XML_NotationDeclHandler p_Var18;
  XML_StartNamespaceDeclHandler p_Var19;
  XML_EndNamespaceDeclHandler p_Var20;
  XML_NotStandaloneHandler p_Var21;
  XML_ExternalEntityRefHandler p_Var22;
  XML_SkippedEntityHandler p_Var23;
  XML_UnknownEncodingHandler p_Var24;
  XML_ElementDeclHandler p_Var25;
  XML_AttlistDeclHandler p_Var26;
  XML_EntityDeclHandler p_Var27;
  XML_XmlDeclHandler p_Var28;
  uint uVar29;
  XML_Bool XVar30;
  XML_Parser parser;
  NAMED *pNVar31;
  XML_Char *pXVar32;
  NAMED *pNVar33;
  PREFIX *pPVar34;
  KEY pXVar35;
  NAMED *pNVar36;
  XML_Char *pXVar37;
  DTD *in_RCX;
  XML_Parser pXVar38;
  long lVar39;
  int iVar40;
  long lVar41;
  KEY local_128;
  XML_Char *local_120;
  HASH_TABLE_ITER local_f8;
  HASH_TABLE *local_e8;
  XML_ProcessingInstructionHandler p_Stack_e0;
  XML_Char *local_d0;
  XML_Char tmp [2];
  undefined6 uStack_c6;
  
  if (oldParser == (XML_Parser)0x0) {
    return (XML_Parser)0x0;
  }
  pDVar4 = oldParser->m_dtd;
  p_Var11 = oldParser->m_startElementHandler;
  p_Var12 = oldParser->m_endElementHandler;
  local_e8 = (HASH_TABLE *)oldParser->m_characterDataHandler;
  p_Stack_e0 = oldParser->m_processingInstructionHandler;
  p_Var13 = oldParser->m_commentHandler;
  p_Var14 = oldParser->m_startCdataSectionHandler;
  p_Var15 = oldParser->m_endCdataSectionHandler;
  p_Var16 = oldParser->m_defaultHandler;
  p_Var17 = oldParser->m_unparsedEntityDeclHandler;
  p_Var18 = oldParser->m_notationDeclHandler;
  p_Var19 = oldParser->m_startNamespaceDeclHandler;
  p_Var20 = oldParser->m_endNamespaceDeclHandler;
  p_Var21 = oldParser->m_notStandaloneHandler;
  p_Var22 = oldParser->m_externalEntityRefHandler;
  p_Var23 = oldParser->m_skippedEntityHandler;
  p_Var24 = oldParser->m_unknownEncodingHandler;
  p_Var25 = oldParser->m_elementDeclHandler;
  p_Var26 = oldParser->m_attlistDeclHandler;
  p_Var27 = oldParser->m_entityDeclHandler;
  p_Var28 = oldParser->m_xmlDeclHandler;
  pEVar5 = oldParser->m_declElementType;
  pXVar38 = (XML_Parser)oldParser->m_userData;
  pXVar6 = (XML_Parser)oldParser->m_handlerArg;
  XVar30 = oldParser->m_defaultExpandInternalEntities;
  pXVar7 = oldParser->m_externalEntityRefHandlerArg;
  XVar1 = oldParser->m_ns_triplets;
  uVar8 = oldParser->m_hash_secret_salt;
  if (oldParser->m_ns == '\0') {
    pXVar32 = (XML_Char *)0x0;
  }
  else {
    in_RCX = (DTD *)CONCAT71((int7)((ulong)in_RCX >> 8),oldParser->m_namespaceSeparator);
    pXVar32 = tmp;
    tmp = (XML_Char  [2])CONCAT11('\0',oldParser->m_namespaceSeparator);
  }
  local_d0 = context;
  parser = parserCreate(encodingName,&oldParser->m_mem,pXVar32,in_RCX);
  if (parser == (XML_Parser)0x0) {
    return (XML_Parser)0x0;
  }
  parser->m_startElementHandler = p_Var11;
  parser->m_endElementHandler = p_Var12;
  parser->m_characterDataHandler = (XML_CharacterDataHandler)local_e8;
  parser->m_processingInstructionHandler = p_Stack_e0;
  parser->m_commentHandler = p_Var13;
  parser->m_startCdataSectionHandler = p_Var14;
  parser->m_endCdataSectionHandler = p_Var15;
  parser->m_defaultHandler = p_Var16;
  parser->m_unparsedEntityDeclHandler = p_Var17;
  parser->m_notationDeclHandler = p_Var18;
  parser->m_startNamespaceDeclHandler = p_Var19;
  parser->m_endNamespaceDeclHandler = p_Var20;
  parser->m_notStandaloneHandler = p_Var21;
  parser->m_externalEntityRefHandler = p_Var22;
  parser->m_skippedEntityHandler = p_Var23;
  parser->m_unknownEncodingHandler = p_Var24;
  parser->m_elementDeclHandler = p_Var25;
  parser->m_attlistDeclHandler = p_Var26;
  parser->m_entityDeclHandler = p_Var27;
  parser->m_xmlDeclHandler = p_Var28;
  parser->m_declElementType = pEVar5;
  parser->m_userData = pXVar38;
  if (pXVar38 != pXVar6) {
    pXVar38 = parser;
  }
  parser->m_handlerArg = pXVar38;
  if (pXVar7 != oldParser) {
    parser->m_externalEntityRefHandlerArg = pXVar7;
  }
  parser->m_defaultExpandInternalEntities = XVar30;
  parser->m_ns_triplets = XVar1;
  parser->m_hash_secret_salt = uVar8;
  parser->m_parentParser = oldParser;
  table_01 = parser->m_dtd;
  local_f8.p = (pDVar4->prefixes).v;
  if (local_f8.p == (NAMED **)0x0) {
    local_f8.end = (NAMED **)0x0;
  }
  else {
    local_f8.end = local_f8.p + (pDVar4->prefixes).size;
  }
  pool = &table_01->pool;
  table = &table_01->prefixes;
  do {
    pNVar31 = hashTableIterNext(&local_f8);
    if (pNVar31 == (NAMED *)0x0) {
      local_f8.p = (pDVar4->attributeIds).v;
      if (local_f8.p == (NAMED **)0x0) {
        local_f8.end = (NAMED **)0x0;
      }
      else {
        local_f8.end = local_f8.p + (pDVar4->attributeIds).size;
      }
      table_00 = &table_01->attributeIds;
      local_e8 = (HASH_TABLE *)&pDVar4->defaultPrefix;
      goto LAB_00483526;
    }
    pXVar32 = poolCopyString(pool,pNVar31->name);
  } while ((pXVar32 != (XML_Char *)0x0) &&
          (pNVar31 = lookup(oldParser,table,pXVar32,0x10), pNVar31 != (NAMED *)0x0));
  goto LAB_004834bf;
LAB_00483526:
  pNVar31 = hashTableIterNext(&local_f8);
  if (pNVar31 != (NAMED *)0x0) {
    pXVar32 = (table_01->pool).ptr;
    if (pXVar32 == (table_01->pool).end) {
      XVar30 = poolGrow(pool);
      if (XVar30 == '\0') goto LAB_004834bf;
      pXVar32 = (table_01->pool).ptr;
    }
    (table_01->pool).ptr = pXVar32 + 1;
    *pXVar32 = '\0';
    pXVar32 = poolCopyString(pool,pNVar31->name);
    if ((pXVar32 == (XML_Char *)0x0) ||
       (pNVar33 = lookup(oldParser,table_00,pXVar32 + 1,0x18), pNVar33 == (NAMED *)0x0))
    goto LAB_004834bf;
    *(undefined1 *)&pNVar33[2].name = *(undefined1 *)&pNVar31[2].name;
    pHVar9 = (HASH_TABLE *)pNVar31[1].name;
    if (pHVar9 != (HASH_TABLE *)0x0) {
      *(undefined1 *)((long)&pNVar33[2].name + 1) = *(undefined1 *)((long)&pNVar31[2].name + 1);
      pPVar34 = &table_01->defaultPrefix;
      if (pHVar9 != local_e8) {
        pPVar34 = (PREFIX *)lookup(oldParser,table,(KEY)pHVar9->v,0);
      }
      pNVar33[1].name = (KEY)pPVar34;
    }
    goto LAB_00483526;
  }
  local_f8.p = (pDVar4->elementTypes).v;
  if (local_f8.p == (NAMED **)0x0) {
    local_f8.end = (NAMED **)0x0;
  }
  else {
    local_f8.end = local_f8.p + (pDVar4->elementTypes).size;
  }
  local_e8 = &table_01->elementTypes;
  while (pNVar31 = hashTableIterNext(&local_f8), pNVar31 != (NAMED *)0x0) {
    pXVar32 = poolCopyString(pool,pNVar31->name);
    if ((pXVar32 == (XML_Char *)0x0) ||
       (pNVar33 = lookup(oldParser,local_e8,pXVar32,0x28), pNVar33 == (NAMED *)0x0))
    goto LAB_004834bf;
    if ((long)*(int *)&pNVar31[3].name != 0) {
      pXVar35 = (KEY)(*(parser->m_mem).malloc_fcn)((long)*(int *)&pNVar31[3].name * 0x18);
      pNVar33[4].name = pXVar35;
      if (pXVar35 == (KEY)0x0) goto LAB_004834bf;
    }
    if (pNVar31[2].name != (KEY)0x0) {
      pNVar36 = lookup(oldParser,table_00,*(KEY *)pNVar31[2].name,0);
      pNVar33[2].name = (KEY)pNVar36;
    }
    uVar3 = *(undefined4 *)&pNVar31[3].name;
    *(undefined4 *)&pNVar33[3].name = uVar3;
    *(undefined4 *)((long)&pNVar33[3].name + 4) = uVar3;
    if (pNVar31[1].name != (KEY)0x0) {
      pNVar36 = lookup(oldParser,table,*(KEY *)pNVar31[1].name,0);
      pNVar33[1].name = (KEY)pNVar36;
    }
    lVar41 = 0;
    for (lVar39 = 0; lVar39 < *(int *)&pNVar33[3].name; lVar39 = lVar39 + 1) {
      pNVar36 = lookup(oldParser,table_00,(KEY)**(undefined8 **)(pNVar31[4].name + lVar41),0);
      pXVar35 = pNVar33[4].name;
      *(NAMED **)(pXVar35 + lVar41) = pNVar36;
      pXVar10 = pNVar31[4].name;
      pXVar35[lVar41 + 8] = pXVar10[lVar41 + 8];
      pXVar32 = *(XML_Char **)(pXVar10 + lVar41 + 0x10);
      if (pXVar32 == (XML_Char *)0x0) {
        pXVar35 = pXVar35 + lVar41 + 0x10;
        pXVar35[0] = '\0';
        pXVar35[1] = '\0';
        pXVar35[2] = '\0';
        pXVar35[3] = '\0';
        pXVar35[4] = '\0';
        pXVar35[5] = '\0';
        pXVar35[6] = '\0';
        pXVar35[7] = '\0';
      }
      else {
        pXVar32 = poolCopyString(pool,pXVar32);
        *(XML_Char **)(pNVar33[4].name + lVar41 + 0x10) = pXVar32;
        if (pXVar32 == (XML_Char *)0x0) goto LAB_004834bf;
      }
      lVar41 = lVar41 + 0x18;
    }
  }
  _tmp = (pDVar4->generalEntities).v;
  local_128 = (KEY)0x0;
  local_120 = (XML_Char *)0x0;
  while (pNVar31 = hashTableIterNext((HASH_TABLE_ITER *)tmp), pNVar31 != (NAMED *)0x0) {
    pXVar32 = poolCopyString(pool,pNVar31->name);
    if ((pXVar32 == (XML_Char *)0x0) ||
       (pNVar33 = lookup(oldParser,&table_01->generalEntities,pXVar32,0x40), pNVar33 == (NAMED *)0x0
       )) goto LAB_004834bf;
    if (pNVar31[3].name == (XML_Char *)0x0) {
      pXVar32 = pNVar31[1].name;
      iVar40 = *(int *)&pNVar31[2].name;
      if (((table_01->pool).ptr == (XML_Char *)0x0) && (XVar30 = poolGrow(pool), XVar30 == '\0'))
      goto LAB_004834bf;
      for (; 0 < iVar40; iVar40 = iVar40 + -1) {
        pXVar37 = (table_01->pool).ptr;
        if (pXVar37 == (table_01->pool).end) {
          XVar30 = poolGrow(pool);
          if (XVar30 == '\0') goto LAB_004834bf;
          pXVar37 = (table_01->pool).ptr;
        }
        XVar2 = *pXVar32;
        (table_01->pool).ptr = pXVar37 + 1;
        *pXVar37 = XVar2;
        pXVar32 = pXVar32 + 1;
      }
      pXVar32 = (table_01->pool).start;
      (table_01->pool).start = (table_01->pool).ptr;
      if (pXVar32 == (XML_Char *)0x0) goto LAB_004834bf;
      pNVar33[1].name = pXVar32;
      *(undefined4 *)&pNVar33[2].name = *(undefined4 *)&pNVar31[2].name;
    }
    else {
      pXVar32 = poolCopyString(pool,pNVar31[3].name);
      if (pXVar32 == (XML_Char *)0x0) goto LAB_004834bf;
      pNVar33[3].name = pXVar32;
      pXVar32 = pNVar31[4].name;
      if (pXVar32 != (XML_Char *)0x0) {
        if ((pXVar32 != local_120) &&
           (local_128 = poolCopyString(pool,pXVar32), local_120 = pXVar32,
           local_128 == (XML_Char *)0x0)) goto LAB_004834bf;
        pNVar33[4].name = local_128;
      }
      if (pNVar31[5].name != (XML_Char *)0x0) {
        pXVar32 = poolCopyString(pool,pNVar31[5].name);
        if (pXVar32 == (XML_Char *)0x0) goto LAB_004834bf;
        pNVar33[5].name = pXVar32;
      }
    }
    if (pNVar31[6].name != (XML_Char *)0x0) {
      pXVar32 = poolCopyString(pool,pNVar31[6].name);
      if (pXVar32 == (XML_Char *)0x0) goto LAB_004834bf;
      pNVar33[6].name = pXVar32;
    }
    *(undefined1 *)((long)&pNVar33[7].name + 1) = *(undefined1 *)((long)&pNVar31[7].name + 1);
    *(undefined1 *)((long)&pNVar33[7].name + 2) = *(undefined1 *)((long)&pNVar31[7].name + 2);
  }
  table_01->keepProcessing = pDVar4->keepProcessing;
  table_01->hasParamEntityRefs = pDVar4->hasParamEntityRefs;
  table_01->standalone = pDVar4->standalone;
  table_01->in_eldecl = pDVar4->in_eldecl;
  table_01->scaffold = pDVar4->scaffold;
  uVar29 = pDVar4->scaffSize;
  table_01->contentStringLen = pDVar4->contentStringLen;
  table_01->scaffSize = uVar29;
  table_01->scaffLevel = pDVar4->scaffLevel;
  table_01->scaffIndex = pDVar4->scaffIndex;
  XVar30 = setContext(parser,local_d0);
  if (XVar30 != '\0') {
    parser->m_processor = externalEntityInitProcessor;
    return parser;
  }
LAB_004834bf:
  XML_ParserFree(parser);
  return (XML_Parser)0x0;
}

Assistant:

XML_Parser XMLCALL
XML_ExternalEntityParserCreate(XML_Parser oldParser, const XML_Char *context,
                               const XML_Char *encodingName) {
  XML_Parser parser = oldParser;
  DTD *newDtd = NULL;
  DTD *oldDtd;
  XML_StartElementHandler oldStartElementHandler;
  XML_EndElementHandler oldEndElementHandler;
  XML_CharacterDataHandler oldCharacterDataHandler;
  XML_ProcessingInstructionHandler oldProcessingInstructionHandler;
  XML_CommentHandler oldCommentHandler;
  XML_StartCdataSectionHandler oldStartCdataSectionHandler;
  XML_EndCdataSectionHandler oldEndCdataSectionHandler;
  XML_DefaultHandler oldDefaultHandler;
  XML_UnparsedEntityDeclHandler oldUnparsedEntityDeclHandler;
  XML_NotationDeclHandler oldNotationDeclHandler;
  XML_StartNamespaceDeclHandler oldStartNamespaceDeclHandler;
  XML_EndNamespaceDeclHandler oldEndNamespaceDeclHandler;
  XML_NotStandaloneHandler oldNotStandaloneHandler;
  XML_ExternalEntityRefHandler oldExternalEntityRefHandler;
  XML_SkippedEntityHandler oldSkippedEntityHandler;
  XML_UnknownEncodingHandler oldUnknownEncodingHandler;
  XML_ElementDeclHandler oldElementDeclHandler;
  XML_AttlistDeclHandler oldAttlistDeclHandler;
  XML_EntityDeclHandler oldEntityDeclHandler;
  XML_XmlDeclHandler oldXmlDeclHandler;
  ELEMENT_TYPE *oldDeclElementType;

  void *oldUserData;
  void *oldHandlerArg;
  XML_Bool oldDefaultExpandInternalEntities;
  XML_Parser oldExternalEntityRefHandlerArg;
#ifdef XML_DTD
  enum XML_ParamEntityParsing oldParamEntityParsing;
  int oldInEntityValue;
#endif
  XML_Bool oldns_triplets;
  /* Note that the new parser shares the same hash secret as the old
     parser, so that dtdCopy and copyEntityTable can lookup values
     from hash tables associated with either parser without us having
     to worry which hash secrets each table has.
  */
  unsigned long oldhash_secret_salt;

  /* Validate the oldParser parameter before we pull everything out of it */
  if (oldParser == NULL)
    return NULL;

  /* Stash the original parser contents on the stack */
  oldDtd = parser->m_dtd;
  oldStartElementHandler = parser->m_startElementHandler;
  oldEndElementHandler = parser->m_endElementHandler;
  oldCharacterDataHandler = parser->m_characterDataHandler;
  oldProcessingInstructionHandler = parser->m_processingInstructionHandler;
  oldCommentHandler = parser->m_commentHandler;
  oldStartCdataSectionHandler = parser->m_startCdataSectionHandler;
  oldEndCdataSectionHandler = parser->m_endCdataSectionHandler;
  oldDefaultHandler = parser->m_defaultHandler;
  oldUnparsedEntityDeclHandler = parser->m_unparsedEntityDeclHandler;
  oldNotationDeclHandler = parser->m_notationDeclHandler;
  oldStartNamespaceDeclHandler = parser->m_startNamespaceDeclHandler;
  oldEndNamespaceDeclHandler = parser->m_endNamespaceDeclHandler;
  oldNotStandaloneHandler = parser->m_notStandaloneHandler;
  oldExternalEntityRefHandler = parser->m_externalEntityRefHandler;
  oldSkippedEntityHandler = parser->m_skippedEntityHandler;
  oldUnknownEncodingHandler = parser->m_unknownEncodingHandler;
  oldElementDeclHandler = parser->m_elementDeclHandler;
  oldAttlistDeclHandler = parser->m_attlistDeclHandler;
  oldEntityDeclHandler = parser->m_entityDeclHandler;
  oldXmlDeclHandler = parser->m_xmlDeclHandler;
  oldDeclElementType = parser->m_declElementType;

  oldUserData = parser->m_userData;
  oldHandlerArg = parser->m_handlerArg;
  oldDefaultExpandInternalEntities = parser->m_defaultExpandInternalEntities;
  oldExternalEntityRefHandlerArg = parser->m_externalEntityRefHandlerArg;
#ifdef XML_DTD
  oldParamEntityParsing = parser->m_paramEntityParsing;
  oldInEntityValue = parser->m_prologState.inEntityValue;
#endif
  oldns_triplets = parser->m_ns_triplets;
  /* Note that the new parser shares the same hash secret as the old
     parser, so that dtdCopy and copyEntityTable can lookup values
     from hash tables associated with either parser without us having
     to worry which hash secrets each table has.
  */
  oldhash_secret_salt = parser->m_hash_secret_salt;

#ifdef XML_DTD
  if (! context)
    newDtd = oldDtd;
#endif /* XML_DTD */

  /* Note that the magical uses of the pre-processor to make field
     access look more like C++ require that `parser' be overwritten
     here.  This makes this function more painful to follow than it
     would be otherwise.
  */
  if (parser->m_ns) {
    XML_Char tmp[2] = {parser->m_namespaceSeparator, 0};
    parser = parserCreate(encodingName, &parser->m_mem, tmp, newDtd);
  } else {
    parser = parserCreate(encodingName, &parser->m_mem, NULL, newDtd);
  }

  if (! parser)
    return NULL;

  parser->m_startElementHandler = oldStartElementHandler;
  parser->m_endElementHandler = oldEndElementHandler;
  parser->m_characterDataHandler = oldCharacterDataHandler;
  parser->m_processingInstructionHandler = oldProcessingInstructionHandler;
  parser->m_commentHandler = oldCommentHandler;
  parser->m_startCdataSectionHandler = oldStartCdataSectionHandler;
  parser->m_endCdataSectionHandler = oldEndCdataSectionHandler;
  parser->m_defaultHandler = oldDefaultHandler;
  parser->m_unparsedEntityDeclHandler = oldUnparsedEntityDeclHandler;
  parser->m_notationDeclHandler = oldNotationDeclHandler;
  parser->m_startNamespaceDeclHandler = oldStartNamespaceDeclHandler;
  parser->m_endNamespaceDeclHandler = oldEndNamespaceDeclHandler;
  parser->m_notStandaloneHandler = oldNotStandaloneHandler;
  parser->m_externalEntityRefHandler = oldExternalEntityRefHandler;
  parser->m_skippedEntityHandler = oldSkippedEntityHandler;
  parser->m_unknownEncodingHandler = oldUnknownEncodingHandler;
  parser->m_elementDeclHandler = oldElementDeclHandler;
  parser->m_attlistDeclHandler = oldAttlistDeclHandler;
  parser->m_entityDeclHandler = oldEntityDeclHandler;
  parser->m_xmlDeclHandler = oldXmlDeclHandler;
  parser->m_declElementType = oldDeclElementType;
  parser->m_userData = oldUserData;
  if (oldUserData == oldHandlerArg)
    parser->m_handlerArg = parser->m_userData;
  else
    parser->m_handlerArg = parser;
  if (oldExternalEntityRefHandlerArg != oldParser)
    parser->m_externalEntityRefHandlerArg = oldExternalEntityRefHandlerArg;
  parser->m_defaultExpandInternalEntities = oldDefaultExpandInternalEntities;
  parser->m_ns_triplets = oldns_triplets;
  parser->m_hash_secret_salt = oldhash_secret_salt;
  parser->m_parentParser = oldParser;
#ifdef XML_DTD
  parser->m_paramEntityParsing = oldParamEntityParsing;
  parser->m_prologState.inEntityValue = oldInEntityValue;
  if (context) {
#endif /* XML_DTD */
    if (! dtdCopy(oldParser, parser->m_dtd, oldDtd, &parser->m_mem)
        || ! setContext(parser, context)) {
      XML_ParserFree(parser);
      return NULL;
    }
    parser->m_processor = externalEntityInitProcessor;
#ifdef XML_DTD
  } else {
    /* The DTD instance referenced by parser->m_dtd is shared between the
       document's root parser and external PE parsers, therefore one does not
       need to call setContext. In addition, one also *must* not call
       setContext, because this would overwrite existing prefix->binding
       pointers in parser->m_dtd with ones that get destroyed with the external
       PE parser. This would leave those prefixes with dangling pointers.
    */
    parser->m_isParamEntity = XML_TRUE;
    XmlPrologStateInitExternalEntity(&parser->m_prologState);
    parser->m_processor = externalParEntInitProcessor;
  }
#endif /* XML_DTD */
  return parser;
}